

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

UniValue * __thiscall UniValue::find_value(UniValue *this,string_view key)

{
  long lVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  ulong __n;
  size_type sVar3;
  UniValue *pUVar4;
  char *in_RSI;
  vector<UniValue,_std::allocator<UniValue>_> *in_RDI;
  long in_FS_OFFSET;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  __sv_type in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  size_t in_stack_ffffffffffffffd0;
  char *pcVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  pvVar6 = in_RDI;
  do {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              in_stack_ffffffffffffffb0._M_str;
    __n = (ulong)uVar5;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_stack_ffffffffffffff98);
    if (sVar3 <= __n) {
      pUVar4 = &NullUniValue;
LAB_002277d1:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return pUVar4;
      }
      __stack_chk_fail();
    }
    pcVar7 = in_RSI;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_RDI,__n);
    in_stack_ffffffffffffffb0 = std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
    __x._M_str = pcVar7;
    __x._M_len = in_stack_ffffffffffffffd0;
    __y._M_len._4_4_ = uVar5;
    __y._M_len._0_4_ = in_stack_ffffffffffffffc0;
    __y._M_str = (char *)pvVar6;
    bVar2 = std::operator==(__x,__y);
    if (bVar2) {
      pUVar4 = std::vector<UniValue,_std::allocator<UniValue>_>::at(in_RDI,__n);
      goto LAB_002277d1;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

const UniValue& UniValue::find_value(std::string_view key) const
{
    for (unsigned int i = 0; i < keys.size(); ++i) {
        if (keys[i] == key) {
            return values.at(i);
        }
    }
    return NullUniValue;
}